

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O1

string * showVector_abi_cxx11_(string *__return_storage_ptr__,vector<int,_std::allocator<int>_> *v)

{
  uint uVar1;
  ulong uVar2;
  stringstream ss;
  stringstream asStack_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  if ((v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      != (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
     ) {
    uVar1 = 1;
    uVar2 = 0;
    do {
      if (uVar1 != 1) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
      }
      std::ostream::operator<<
                ((ostream *)local_1a8,
                 (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_start[uVar2]);
      uVar2 = (ulong)uVar1;
      uVar1 = uVar1 + 1;
    } while (uVar2 < (ulong)((long)(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start >> 2));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string showVector(const std::vector<int>& v) {
	std::stringstream ss;
	for (unsigned int i = 0; i < v.size(); i++) {
		if (i > 0) {
			ss << " ";
		}
		ss << v[i];
	}
	return ss.str();
}